

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_descriptor_sh(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *pmVar2;
  int iVar3;
  
  if (parent == (miniscript_node_t *)0x0) {
    iVar3 = 0;
    pmVar1 = node->child;
    for (pmVar2 = pmVar1; pmVar2 != (miniscript_node_t *)0x0; pmVar2 = pmVar2->next) {
      iVar3 = iVar3 + 1;
    }
    if ((iVar3 == node->info->inner_num) && (pmVar1->info != (miniscript_item_t *)0x0)) {
      node->type_properties = pmVar1->type_properties;
      return 0;
    }
  }
  return -2;
}

Assistant:

static int verify_descriptor_sh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent || (get_child_list_count(node) != node->info->inner_num) || !node->child->info)
        return WALLY_EINVAL;

    node->type_properties = node->child->type_properties;
    return WALLY_OK;
}